

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtered_re2.cc
# Opt level: O2

void __thiscall
re2::FilteredRE2::Compile
          (FilteredRE2 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *atoms)

{
  pointer ppRVar1;
  Prefilter *f;
  ostream *poVar2;
  pointer ppRVar3;
  size_t i;
  ulong uVar4;
  LogMessage LStack_198;
  
  if (this->compiled_ == false) {
    ppRVar1 = (this->re2_vec_).super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppRVar3 = (this->re2_vec_).super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppRVar3 != ppRVar1) {
      for (uVar4 = 0; uVar4 < (ulong)((long)ppRVar3 - (long)ppRVar1 >> 3); uVar4 = uVar4 + 1) {
        f = Prefilter::FromRE2(ppRVar1[uVar4]);
        PrefilterTree::Add(this->prefilter_tree_,f);
        ppRVar1 = (this->re2_vec_).super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppRVar3 = (this->re2_vec_).super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(atoms);
      PrefilterTree::Compile(this->prefilter_tree_,atoms);
      this->compiled_ = true;
      return;
    }
  }
  LogMessage::LogMessage
            (&LStack_198,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/filtered_re2.cc",
             0x2d,0);
  poVar2 = std::operator<<((ostream *)&LStack_198.str_,"C: ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  poVar2 = std::operator<<(poVar2," S:");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  LogMessage::~LogMessage(&LStack_198);
  return;
}

Assistant:

void FilteredRE2::Compile(vector<string>* atoms) {
  if (compiled_ || re2_vec_.size() == 0) {
    LOG(INFO) << "C: " << compiled_ << " S:" << re2_vec_.size();
    return;
  }

  for (size_t i = 0; i < re2_vec_.size(); i++) {
    Prefilter* prefilter = Prefilter::FromRE2(re2_vec_[i]);
    prefilter_tree_->Add(prefilter);
  }
  atoms->clear();
  prefilter_tree_->Compile(atoms);
  compiled_ = true;
}